

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_lower(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  size_t l;
  luaL_Buffer b;
  
  pcVar2 = luaL_checklstring(L,1,&l);
  pcVar3 = luaL_buffinitsize(L,&b,l);
  for (uVar4 = 0; uVar4 < l; uVar4 = uVar4 + 1) {
    iVar1 = tolower((uint)(byte)pcVar2[uVar4]);
    pcVar3[uVar4] = (char)iVar1;
  }
  luaL_pushresultsize(&b,l);
  return 1;
}

Assistant:

static int str_lower (lua_State *L) {
  size_t l;
  size_t i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  char *p = luaL_buffinitsize(L, &b, l);
  for (i=0; i<l; i++)
    p[i] = tolower(uchar(s[i]));
  luaL_pushresultsize(&b, l);
  return 1;
}